

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

ExprBase * GetFunctionTable(ExpressionContext *ctx,SynBase *source,FunctionData *function)

{
  uint uVar1;
  uint uniqueId;
  Allocator *allocator;
  ScopeData *pSVar2;
  int iVar3;
  uint offset;
  VariableData **ppVVar4;
  undefined4 extraout_var;
  TypeUnsizedArray *type;
  VariableData *pVVar5;
  SynIdentifier *name;
  undefined4 extraout_var_02;
  char *__function;
  TypeBase *pTVar6;
  VariableData *variable;
  InplaceStr vtableName;
  ExprVariableAccess *this;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  pTVar6 = function->type->returnType;
  if ((pTVar6 != (TypeBase *)0x0) && (pTVar6->typeID == 0xe)) {
    __assert_fail("!isType<TypeAuto>(function->type->returnType)",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                  ,0x1ba5,
                  "ExprBase *GetFunctionTable(ExpressionContext &, SynBase *, FunctionData *)");
  }
  vtableName = GetFunctionTableName(ctx,function);
  ppVVar4 = SmallDenseMap<InplaceStr,_VariableData_*,_InplaceStrHasher,_128U>::find
                      (&ctx->vtableMap,&vtableName);
  if (ppVVar4 != (VariableData **)0x0) {
    iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
    this = (ExprVariableAccess *)CONCAT44(extraout_var,iVar3);
    pTVar6 = (*ppVVar4)->type;
    pVVar5 = *ppVVar4;
LAB_001ef92d:
    ExprVariableAccess::ExprVariableAccess(this,source,pTVar6,pVVar5);
    return &this->super_ExprBase;
  }
  type = ExpressionContext::GetUnsizedArrayType(ctx,ctx->typeFunctionID);
  offset = anon_unknown.dwarf_1117a3::AllocateGlobalVariable
                     (ctx,source,(type->super_TypeStruct).super_TypeBase.alignment,
                      (type->super_TypeStruct).super_TypeBase.size);
  iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x170);
  pVVar5 = (VariableData *)CONCAT44(extraout_var_00,iVar3);
  allocator = ctx->allocator;
  pSVar2 = ctx->globalScope;
  uVar1 = (type->super_TypeStruct).super_TypeBase.alignment;
  iVar3 = (*allocator->_vptr_Allocator[2])(allocator,0x50);
  name = (SynIdentifier *)CONCAT44(extraout_var_01,iVar3);
  (name->super_SynBase).typeID = 4;
  (name->super_SynBase).begin = (Lexeme *)0x0;
  (name->super_SynBase).end = (Lexeme *)0x0;
  (name->super_SynBase).pos.begin = (char *)0x0;
  (name->super_SynBase).pos.end = (char *)0x0;
  *(undefined8 *)((long)&(name->super_SynBase).pos.end + 2) = 0;
  *(undefined8 *)((long)&(name->super_SynBase).next + 2) = 0;
  (name->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_003e6190;
  (name->name).begin = vtableName.begin;
  (name->name).end = vtableName.end;
  uniqueId = ctx->uniqueVariableId;
  ctx->uniqueVariableId = uniqueId + 1;
  VariableData::VariableData
            (pVVar5,allocator,source,pSVar2,uVar1,(TypeBase *)type,name,offset,uniqueId);
  pSVar2 = ctx->globalScope;
  uVar1 = (pSVar2->variables).count;
  variable = pVVar5;
  if (uVar1 == (pSVar2->variables).max) {
    SmallArray<VariableData_*,_4U>::grow(&pSVar2->variables,uVar1);
  }
  ppVVar4 = (pSVar2->variables).data;
  if (ppVVar4 != (VariableData **)0x0) {
    uVar1 = (pSVar2->variables).count;
    (pSVar2->variables).count = uVar1 + 1;
    ppVVar4[uVar1] = pVVar5;
    pSVar2 = ctx->globalScope;
    uVar1 = (pSVar2->allVariables).count;
    if (uVar1 == (pSVar2->allVariables).max) {
      SmallArray<VariableData_*,_4U>::grow(&pSVar2->allVariables,uVar1);
    }
    ppVVar4 = (pSVar2->allVariables).data;
    if (ppVVar4 != (VariableData **)0x0) {
      uVar1 = (pSVar2->allVariables).count;
      (pSVar2->allVariables).count = uVar1 + 1;
      ppVVar4[uVar1] = pVVar5;
      uVar1 = (ctx->variables).count;
      if (uVar1 == (ctx->variables).max) {
        SmallArray<VariableData_*,_128U>::grow(&ctx->variables,uVar1);
      }
      ppVVar4 = (ctx->variables).data;
      if (ppVVar4 != (VariableData **)0x0) {
        uVar1 = (ctx->variables).count;
        (ctx->variables).count = uVar1 + 1;
        ppVVar4[uVar1] = pVVar5;
        uVar1 = (ctx->vtables).count;
        if (uVar1 == (ctx->vtables).max) {
          SmallArray<VariableData_*,_128U>::grow(&ctx->vtables,uVar1);
        }
        ppVVar4 = (ctx->vtables).data;
        if (ppVVar4 != (VariableData **)0x0) {
          uVar1 = (ctx->vtables).count;
          (ctx->vtables).count = uVar1 + 1;
          ppVVar4[uVar1] = pVVar5;
          SmallDenseMap<InplaceStr,_VariableData_*,_InplaceStrHasher,_128U>::insert
                    (&ctx->vtableMap,&vtableName,&variable);
          iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
          this = (ExprVariableAccess *)CONCAT44(extraout_var_02,iVar3);
          pTVar6 = variable->type;
          pVVar5 = variable;
          goto LAB_001ef92d;
        }
      }
      __function = 
      "void SmallArray<VariableData *, 128>::push_back(const T &) [T = VariableData *, N = 128]";
      goto LAB_001ef970;
    }
  }
  __function = 
  "void SmallArray<VariableData *, 4>::push_back(const T &) [T = VariableData *, N = 4]";
LAB_001ef970:
  __assert_fail("data",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x162,__function);
}

Assistant:

ExprBase* GetFunctionTable(ExpressionContext &ctx, SynBase *source, FunctionData *function)
{
	assert(!isType<TypeAuto>(function->type->returnType));

	InplaceStr vtableName = GetFunctionTableName(ctx, function);

	if(VariableData **variable = ctx.vtableMap.find(vtableName))
	{
		return new (ctx.get<ExprVariableAccess>()) ExprVariableAccess(source, (*variable)->type, *variable);
	}
	
	TypeBase *type = ctx.GetUnsizedArrayType(ctx.typeFunctionID);

	unsigned offset = AllocateGlobalVariable(ctx, source, type->alignment, type->size);
	VariableData *variable = new (ctx.get<VariableData>()) VariableData(ctx.allocator, source, ctx.globalScope, type->alignment, type, new (ctx.get<SynIdentifier>()) SynIdentifier(vtableName), offset, ctx.uniqueVariableId++);

	ctx.globalScope->variables.push_back(variable);
	ctx.globalScope->allVariables.push_back(variable);

	ctx.variables.push_back(variable);

	ctx.vtables.push_back(variable);
	ctx.vtableMap.insert(vtableName, variable);

	return new (ctx.get<ExprVariableAccess>()) ExprVariableAccess(source, variable->type, variable);
}